

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

void pack_grammar(void)

{
  arg_cache *paVar1;
  arg_cache *__ptr;
  Yshort *pYVar2;
  bucket **ppbVar3;
  bucket **ppbVar4;
  bucket *pbVar5;
  long lVar6;
  Yshort *pYVar7;
  Yshort YVar8;
  ulong uVar9;
  char cVar10;
  Yshort YVar11;
  int i;
  
  ritem = (Yshort *)allocate(nitems << 2);
  if (ritem == (Yshort *)0x0) {
    no_space();
  }
  rlhs = (Yshort *)allocate(nrules << 2);
  if (rlhs == (Yshort *)0x0) {
    no_space();
  }
  rrhs = (Yshort *)allocate(nrules * 4 + 4);
  if (rrhs == (Yshort *)0x0) {
    no_space();
  }
  rprec = (Yshort *)realloc(rprec,(ulong)(uint)(nrules << 2));
  if (rprec == (Yshort *)0x0) {
    no_space();
  }
  rassoc = (char *)realloc(rassoc,(ulong)(uint)nrules);
  if (rassoc == (char *)0x0) {
    no_space();
  }
  pYVar7 = ritem;
  *ritem = -1;
  pYVar7[1] = goal->index;
  pYVar7[2] = 0;
  pYVar2 = rlhs;
  pYVar7[3] = -2;
  pYVar7 = rlhs;
  pYVar7[0] = 0;
  pYVar7[1] = 0;
  pYVar2[2] = start_symbol;
  pYVar7 = rrhs;
  pYVar7[0] = 0;
  pYVar7[1] = 0;
  pYVar7[2] = 1;
  ppbVar4 = plhs;
  ppbVar3 = pitem;
  YVar11 = 4;
  if (nrules < 4) {
    uVar9 = 3;
  }
  else {
    uVar9 = 3;
    do {
      pbVar5 = ppbVar4[uVar9];
      if (0 < pbVar5->args) {
        if (pbVar5->argnames != (char **)0x0) {
          free(pbVar5->argnames);
          ppbVar4[uVar9]->argnames = (char **)0x0;
          pbVar5 = ppbVar4[uVar9];
        }
        if (pbVar5->argtags != (char **)0x0) {
          free(pbVar5->argtags);
          ppbVar4[uVar9]->argtags = (char **)0x0;
          pbVar5 = ppbVar4[uVar9];
        }
      }
      rlhs[uVar9] = pbVar5->index;
      rrhs[uVar9] = YVar11;
      pYVar7 = ritem;
      lVar6 = (long)YVar11;
      pbVar5 = ppbVar3[lVar6];
      if (pbVar5 == (bucket *)0x0) {
        cVar10 = '\0';
        YVar8 = 0;
      }
      else {
        YVar8 = 0;
        cVar10 = '\0';
        do {
          pYVar7[lVar6] = pbVar5->index;
          if (pbVar5->class == '\x01') {
            YVar8 = pbVar5->prec;
            cVar10 = pbVar5->assoc;
          }
          pbVar5 = ppbVar3[lVar6 + 1];
          lVar6 = lVar6 + 1;
          YVar11 = YVar11 + 1;
        } while (pbVar5 != (bucket *)0x0);
      }
      pYVar7[lVar6] = -(int)uVar9;
      if (rprec[uVar9] == -1) {
        rprec[uVar9] = YVar8;
        rassoc[uVar9] = cVar10;
      }
      YVar11 = YVar11 + 1;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)nrules);
    uVar9 = uVar9 & 0xffffffff;
    pYVar7 = rrhs;
  }
  ppbVar4 = plhs;
  ppbVar3 = pitem;
  pYVar7[uVar9] = YVar11;
  free(ppbVar4);
  free(ppbVar3);
  lVar6 = 0;
  do {
    __ptr = arg_cache[lVar6];
    while (__ptr != (arg_cache *)0x0) {
      free(__ptr->code);
      paVar1 = __ptr->next;
      free(__ptr);
      __ptr = paVar1;
    }
    arg_cache[lVar6] = (arg_cache *)0x0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  return;
}

Assistant:

void pack_grammar()
{
    register int i, j;
    int assoc, prec;

    ritem = NEW2(nitems, Yshort);
    if (ritem == 0) no_space();
    rlhs = NEW2(nrules, Yshort);
    if (rlhs == 0) no_space();
    rrhs = NEW2(nrules+1, Yshort);
    if (rrhs == 0) no_space();
    rprec = RENEW(rprec, nrules, Yshort);
    if (rprec == 0) no_space();
    rassoc = RENEW(rassoc, nrules, char);
    if (rassoc == 0) no_space();

    ritem[0] = -1;
    ritem[1] = goal->index;
    ritem[2] = 0;
    ritem[3] = -2;
    rlhs[0] = 0;
    rlhs[1] = 0;
    rlhs[2] = start_symbol;
    rrhs[0] = 0;
    rrhs[1] = 0;
    rrhs[2] = 1;

    j = 4;
    for (i = 3; i < nrules; ++i) {
	if (plhs[i]->args > 0) {
	  if (plhs[i]->argnames) {
	    FREE(plhs[i]->argnames);
	    plhs[i]->argnames = 0;
	  }
	  if (plhs[i]->argtags) {
	    FREE(plhs[i]->argtags);
	    plhs[i]->argtags = 0;
	  }
	}
	rlhs[i] = plhs[i]->index;
	rrhs[i] = j;
	assoc = TOKEN;
	prec = 0;
	while (pitem[j]) {
	    ritem[j] = pitem[j]->index;
	    if (pitem[j]->class == TERM) {
		prec = pitem[j]->prec;
		assoc = pitem[j]->assoc; }
	    ++j; }
	ritem[j] = -i;
	++j;
	if (rprec[i] == UNDEFINED) {
	    rprec[i] = prec;
	    rassoc[i] = assoc; } }
    rrhs[i] = j;
    FREE(plhs);
    FREE(pitem);
    clean_arg_cache();
}